

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

size_t Curl_cwriter_count(Curl_easy *data,Curl_cwriter_phase phase)

{
  size_t local_28;
  size_t n;
  Curl_cwriter *w;
  Curl_cwriter_phase phase_local;
  Curl_easy *data_local;
  
  local_28 = 0;
  for (n = (size_t)(data->req).writer_stack; n != 0; n = *(size_t *)(n + 8)) {
    if (*(Curl_cwriter_phase *)(n + 0x18) == phase) {
      local_28 = local_28 + 1;
    }
  }
  return local_28;
}

Assistant:

size_t Curl_cwriter_count(struct Curl_easy *data, Curl_cwriter_phase phase)
{
  struct Curl_cwriter *w;
  size_t n = 0;

  for(w = data->req.writer_stack; w; w = w->next) {
    if(w->phase == phase)
      ++n;
  }
  return n;
}